

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

char * trex_matchnode(TRex *exp,TRexNode *node,char *str,TRexNode *next)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  TRexBool TVar4;
  int iVar5;
  char *str_00;
  char *pcVar6;
  ushort **ppuVar7;
  bool bVar8;
  TRex *local_c0;
  TRex *local_b8;
  TRexNode *local_a0;
  TRexNode *subnext;
  TRex *pTStack_90;
  int capture;
  char *cur;
  TRexNode *n;
  TRexNode *temp;
  char *asd;
  TRexNode *gnext;
  char *stop;
  char *good;
  char *s;
  int nmaches;
  int p1;
  int p0;
  TRexNode *greedystop;
  TRexNodeType type;
  TRexNode *next_local;
  char *str_local;
  TRexNode *node_local;
  TRex *exp_local;
  
  iVar5 = node->type;
  exp_local = (TRex *)str;
  switch(iVar5) {
  case 0x100:
    uVar2 = node->right >> 0x10 & 0xffff;
    uVar3 = node->right & 0xffff;
    s._4_4_ = 0;
    good = str;
    _p1 = next;
    if (node->next != -1) {
      _p1 = exp->_nodes + node->next;
      good = str;
    }
    do {
      stop = good;
      if ((s._4_4_ != 0xffff && (int)uVar3 <= (int)s._4_4_) ||
         (str_00 = trex_matchnode(exp,exp->_nodes + node->left,good,_p1), stop = good,
         str_00 == (char *)0x0)) break;
      s._4_4_ = s._4_4_ + 1;
      stop = str_00;
      if ((_p1 != (TRexNode *)0x0) &&
         ((_p1->type != 0x100 || ((_p1->type == 0x100 && ((_p1->right >> 0x10 & 0xffffU) != 0))))))
      {
        asd = (char *)0x0;
        if (_p1->next == -1) {
          if ((next != (TRexNode *)0x0) && (next->next != -1)) {
            asd = (char *)(exp->_nodes + next->next);
          }
        }
        else {
          asd = (char *)(exp->_nodes + _p1->next);
        }
        pcVar6 = trex_matchnode(exp,_p1,str_00,(TRexNode *)asd);
        if ((pcVar6 != (char *)0x0) &&
           ((((uVar2 == uVar3 && (uVar2 == s._4_4_)) ||
             (((int)uVar2 <= (int)s._4_4_ && (uVar3 == 0xffff)))) ||
            (((int)uVar2 <= (int)s._4_4_ && ((int)s._4_4_ <= (int)uVar3)))))) break;
      }
      good = str_00;
    } while (str_00 < exp->_eol);
    if ((uVar2 == uVar3) && (uVar2 == s._4_4_)) {
      exp_local = (TRex *)stop;
    }
    else if (((int)s._4_4_ < (int)uVar2) || (uVar3 != 0xffff)) {
      if (((int)s._4_4_ < (int)uVar2) || ((int)uVar3 < (int)s._4_4_)) {
        exp_local = (TRex *)0x0;
      }
      else {
        exp_local = (TRex *)stop;
      }
    }
    else {
      exp_local = (TRex *)stop;
    }
    break;
  case 0x101:
    n = exp->_nodes + node->left;
    temp = (TRexNode *)str;
    while (temp = (TRexNode *)trex_matchnode(exp,n,(char *)temp,(TRexNode *)0x0),
          temp != (TRexNode *)0x0) {
      if (n->next == -1) {
        return (char *)temp;
      }
      n = exp->_nodes + n->next;
    }
    n = exp->_nodes + node->right;
    temp = (TRexNode *)str;
    while (temp = (TRexNode *)trex_matchnode(exp,n,(char *)temp,(TRexNode *)0x0),
          temp != (TRexNode *)0x0) {
      if (n->next == -1) {
        return (char *)temp;
      }
      n = exp->_nodes + n->next;
    }
    exp_local = (TRex *)0x0;
    break;
  case 0x102:
  case 0x103:
    cur = (char *)(exp->_nodes + node->left);
    subnext._4_4_ = -1;
    pTStack_90 = (TRex *)str;
    if ((node->type != 0x103) && (node->right == exp->_currsubexp)) {
      subnext._4_4_ = exp->_currsubexp;
      exp->_matches[subnext._4_4_].begin = str;
      exp->_currsubexp = exp->_currsubexp + 1;
    }
    do {
      local_a0 = next;
      if (*(int *)(cur + 0xc) != -1) {
        local_a0 = exp->_nodes + *(int *)(cur + 0xc);
      }
      pTStack_90 = (TRex *)trex_matchnode(exp,(TRexNode *)cur,(char *)pTStack_90,local_a0);
      if (pTStack_90 == (TRex *)0x0) {
        if (subnext._4_4_ != -1) {
          exp->_matches[subnext._4_4_].begin = (char *)0x0;
          exp->_matches[subnext._4_4_].len = 0;
        }
        return (char *)0x0;
      }
      bVar8 = false;
      if (*(int *)(cur + 0xc) != -1) {
        cur = (char *)(exp->_nodes + *(int *)(cur + 0xc));
        bVar8 = (TRexNode *)cur != (TRexNode *)0x0;
      }
    } while (bVar8);
    exp_local = pTStack_90;
    if (subnext._4_4_ != -1) {
      exp->_matches[subnext._4_4_].len = (int)pTStack_90 - (int)exp->_matches[subnext._4_4_].begin;
    }
    break;
  case 0x104:
    exp_local = (TRex *)(str + 1);
    break;
  case 0x105:
  case 0x107:
    TVar4 = trex_matchclass(exp,exp->_nodes + node->left,*str);
    if (TVar4 == 0) {
      if (iVar5 != 0x107) {
        return (char *)0x0;
      }
    }
    else if (iVar5 != 0x105) {
      return (char *)0x0;
    }
    exp_local = (TRex *)(str + 1);
    break;
  case 0x106:
    TVar4 = trex_matchcclass(node->left,*str);
    if (TVar4 == 0) {
      exp_local = (TRex *)0x0;
    }
    else {
      exp_local = (TRex *)(str + 1);
    }
    break;
  default:
    if ((exp->_flags & 1U) == 0) {
      if ((int)*str != node->type) {
        return (char *)0x0;
      }
    }
    else {
      cVar1 = *str;
      iVar5 = tolower(node->type);
      if ((cVar1 != iVar5) && (cVar1 = *str, iVar5 = toupper(node->type), cVar1 != iVar5)) {
        return (char *)0x0;
      }
    }
    exp_local = (TRex *)(str + 1);
    break;
  case 0x10a:
    if (str != exp->_eol) {
      exp_local = (TRex *)0x0;
    }
    break;
  case 0x10b:
    if (str != exp->_bol) {
      exp_local = (TRex *)0x0;
    }
    break;
  case 0x10c:
    if (((((str == exp->_bol) && (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)*str] & 0x2000) == 0))
         || ((str == exp->_eol &&
             (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)str[-1]] & 0x2000) == 0)))) ||
        ((ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)*str] & 0x2000) == 0 &&
         (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)str[1]] & 0x2000) != 0)))) ||
       ((ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)*str] & 0x2000) != 0 &&
        (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)str[1]] & 0x2000) == 0)))) {
      local_b8 = (TRex *)str;
      if (node->left != 0x62) {
        local_b8 = (TRex *)0x0;
      }
      exp_local = local_b8;
    }
    else {
      local_c0 = (TRex *)str;
      if (node->left == 0x62) {
        local_c0 = (TRex *)0x0;
      }
      exp_local = local_c0;
    }
  }
  return (char *)exp_local;
}

Assistant:

static const TRexChar * trex_matchnode(TRex * exp, TRexNode * node, const TRexChar * str, TRexNode * next) {

	TRexNodeType type = node->type;

	switch (type) {
		case OP_GREEDY: {
			//TRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
			TRexNode * greedystop = NULL;
			int p0 = (node->right >> 16) & 0x0000FFFF, p1 = node->right & 0x0000FFFF, nmaches = 0;
			const TRexChar * s = str, *good = str;

			if (node->next != -1) {
				greedystop = &exp->_nodes[node->next];
			} else {
				greedystop = next;
			}

			while ((nmaches == 0xFFFF || nmaches < p1)) {

				const TRexChar * stop;

				if (!(s = trex_matchnode(exp, &exp->_nodes[node->left], s, greedystop))) {
					break;
				}

				nmaches++;
				good = s;

				if (greedystop) {
					//checks that 0 matches satisfy the expression(if so skips)
					//if not would always stop(for instance if is a '?')
					if (greedystop->type != OP_GREEDY ||
							(greedystop->type == OP_GREEDY && ((greedystop->right >> 16) & 0x0000FFFF) != 0)) {
						TRexNode * gnext = NULL;

						if (greedystop->next != -1) {
							gnext = &exp->_nodes[greedystop->next];
						} else if (next && next->next != -1) {
							gnext = &exp->_nodes[next->next];
						}

						stop = trex_matchnode(exp, greedystop, s, gnext);

						if (stop) {
							//if satisfied stop it
							if (p0 == p1 && p0 == nmaches) {
								break;
							} else if (nmaches >= p0 && p1 == 0xFFFF) {
								break;
							} else if (nmaches >= p0 && nmaches <= p1) {
								break;
							}
						}
					}
				}

				if (s >= exp->_eol) {
					break;
				}
			}

			if (p0 == p1 && p0 == nmaches) {
				return good;
			} else if (nmaches >= p0 && p1 == 0xFFFF) {
				return good;
			} else if (nmaches >= p0 && nmaches <= p1) {
				return good;
			}

			return NULL;
		}

		case OP_OR: {
			const TRexChar * asd = str;
			TRexNode * temp = &exp->_nodes[node->left];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			asd = str;
			temp = &exp->_nodes[node->right];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			return NULL;
			break;
		}

		case OP_EXPR:
		case OP_NOCAPEXPR: {
			TRexNode * n = &exp->_nodes[node->left];
			const TRexChar * cur = str;
			int capture = -1;

			if (node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
				capture = exp->_currsubexp;
				exp->_matches[capture].begin = cur;
				exp->_currsubexp++;
			}

			do {
				TRexNode * subnext = NULL;

				if (n->next != -1) {
					subnext = &exp->_nodes[n->next];
				} else {
					subnext = next;
				}

				if (!(cur = trex_matchnode(exp, n, cur, subnext))) {
					if (capture != -1) {
						exp->_matches[capture].begin = 0;
						exp->_matches[capture].len = 0;
					}

					return NULL;
				}
			} while ((n->next != -1) && (n = &exp->_nodes[n->next]));

			if (capture != -1) {
				exp->_matches[capture].len = cur - exp->_matches[capture].begin;
			}

			return cur;
		}

		case OP_WB:
			if ((str == exp->_bol && !isspace(*str))
					|| ((str == exp->_eol && !isspace(*(str - 1))))
					|| ((!isspace(*str) && isspace(*(str + 1))))
					|| ((isspace(*str) && !isspace(*(str + 1)))) ) {
				return (node->left == 'b') ? str : NULL;
			}

			return (node->left == 'b') ? NULL : str;

		case OP_BOL:
			if (str == exp->_bol) {
				return str;
			}

			return NULL;

		case OP_EOL:
			if (str == exp->_eol) {
				return str;
			}

			return NULL;

		case OP_DOT:
			str++;
			return str;

		case OP_NCLASS:
		case OP_CLASS:
			if (trex_matchclass(exp, &exp->_nodes[node->left], *str) ? (type == OP_CLASS ? TRex_True : TRex_False) : (type == OP_NCLASS ? TRex_True : TRex_False)) {
				str++;
				return str;
			}

			return NULL;

		case OP_CCLASS:
			if (trex_matchcclass(node->left, *str)) {
				str++;
				return str;
			}

			return NULL;

		default: /* char */
			if (exp->_flags & TREX_ICASE) {
				if (*str != tolower(node->type) && *str != toupper(node->type)) {
					return NULL;
				}
			} else {
				if (*str != node->type) {
					return NULL;
				}
			}

			str++;
			return str;
	}

	return NULL;
}